

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_close(uv_stream_t *handle)

{
  void *pvVar1;
  int iVar2;
  uv__stream_queued_fds_t *queued_fds;
  uint i;
  uv_stream_t *handle_local;
  
  uv__io_close(handle->loop,&handle->io_watcher);
  uv_read_stop(handle);
  if (((handle->flags & 4) != 0) &&
     (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
    handle->loop->active_handles = handle->loop->active_handles - 1;
  }
  handle->flags = handle->flags & 0xffff3fff;
  if ((handle->io_watcher).fd != -1) {
    if (2 < (handle->io_watcher).fd) {
      uv__close((handle->io_watcher).fd);
    }
    (handle->io_watcher).fd = -1;
  }
  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }
  if (handle->queued_fds != (void *)0x0) {
    pvVar1 = handle->queued_fds;
    for (queued_fds._4_4_ = 0; queued_fds._4_4_ < *(uint *)((long)pvVar1 + 4);
        queued_fds._4_4_ = queued_fds._4_4_ + 1) {
      uv__close(*(int *)((long)pvVar1 + (ulong)queued_fds._4_4_ * 4 + 8));
    }
    uv__free(handle->queued_fds);
    handle->queued_fds = (void *)0x0;
  }
  iVar2 = uv__io_active(&handle->io_watcher,5);
  if (iVar2 != 0) {
    __assert_fail("!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x654,"void uv__stream_close(uv_stream_t *)");
  }
  return;
}

Assistant:

void uv__stream_close(uv_stream_t* handle) {
  unsigned int i;
  uv__stream_queued_fds_t* queued_fds;

#if defined(__APPLE__) && !defined(CMAKE_BOOTSTRAP)
  /* Terminate select loop first */
  if (handle->select != NULL) {
    uv__stream_select_t* s;

    s = handle->select;

    uv_sem_post(&s->close_sem);
    uv_sem_post(&s->async_sem);
    uv__stream_osx_interrupt_select(handle);
    uv_thread_join(&s->thread);
    uv_sem_destroy(&s->close_sem);
    uv_sem_destroy(&s->async_sem);
    uv__close(s->fake_fd);
    uv__close(s->int_fd);
    uv_close((uv_handle_t*) &s->async, uv__stream_osx_cb_close);

    handle->select = NULL;
  }
#endif /* defined(__APPLE__) */

  uv__io_close(handle->loop, &handle->io_watcher);
  uv_read_stop(handle);
  uv__handle_stop(handle);
  handle->flags &= ~(UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);

  if (handle->io_watcher.fd != -1) {
    /* Don't close stdio file descriptors.  Nothing good comes from it. */
    if (handle->io_watcher.fd > STDERR_FILENO)
      uv__close(handle->io_watcher.fd);
    handle->io_watcher.fd = -1;
  }

  if (handle->accepted_fd != -1) {
    uv__close(handle->accepted_fd);
    handle->accepted_fd = -1;
  }

  /* Close all queued fds */
  if (handle->queued_fds != NULL) {
    queued_fds = handle->queued_fds;
    for (i = 0; i < queued_fds->offset; i++)
      uv__close(queued_fds->fds[i]);
    uv__free(handle->queued_fds);
    handle->queued_fds = NULL;
  }

  assert(!uv__io_active(&handle->io_watcher, POLLIN | POLLOUT));
}